

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadLinkingSection(BinaryReader *this,Offset section_size)

{
  uint32_t uVar1;
  int iVar2;
  Result RVar3;
  Enum EVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint local_78;
  uint32_t value_1;
  uint32_t kind;
  uint32_t flags;
  uint32_t value;
  char *pcStack_60;
  uint32_t index;
  uint32_t size;
  uint32_t linking_type;
  ulong local_48;
  uint32_t version;
  ulong local_38;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc9])();
  if (iVar2 == 0) {
    RVar3 = ReadU32Leb128(this,&version,"version");
    EVar4 = Error;
    if (RVar3.enum_ != Error) {
      if (version == 2) {
        if ((this->state_).offset < this->read_end_) {
          do {
            RVar3 = ReadU32Leb128(this,&linking_type,"type");
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            RVar3 = ReadU32Leb128(this,&value,"subsection size");
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            uVar9 = (this->state_).offset + (_value & 0xffffffff);
            uVar6 = this->read_end_;
            if (uVar6 < uVar9) {
              pcVar5 = "invalid sub-section size: extends past end";
              goto LAB_00112e82;
            }
            this->read_end_ = uVar9;
            switch(linking_type) {
            case 5:
              RVar3 = ReadU32Leb128(this,&local_78,"info count");
              if (RVar3.enum_ == Error) goto LAB_00112f84;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd1])
                                (this->delegate_,(ulong)local_78);
              if (iVar2 != 0) {
                pcVar5 = "OnSegmentInfoCount callback failed";
LAB_00112f35:
                PrintError(this,pcVar5);
                goto LAB_00112f84;
              }
              if (local_78 != 0) {
                uVar8 = 0;
                do {
                  _value = 0;
                  pcStack_60 = (char *)0x0;
                  RVar3 = ReadStr(this,(string_view *)&value,"segment name");
                  if (RVar3.enum_ == Error) goto LAB_00112f84;
                  RVar3 = ReadU32Leb128(this,&value_1,"segment alignment");
                  local_48 = (ulong)value_1;
                  if (RVar3.enum_ == Error) goto LAB_00112f84;
                  if (0x1f < value_1) {
                    PrintError(this,"invalid %s: %u","segment alignment",local_48);
                    goto LAB_00112f84;
                  }
                  RVar3 = ReadU32Leb128(this,&flags,"segment flags");
                  if (RVar3.enum_ == Error) goto LAB_00112f84;
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd2])
                                    (this->delegate_,uVar8,_value,pcStack_60,local_48,(ulong)flags);
                  if (iVar2 != 0) {
                    pcVar5 = "OnSegmentInfo callback failed";
                    goto LAB_00112f35;
                  }
                  uVar7 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar7;
                } while (uVar7 < local_78);
              }
              break;
            case 6:
              RVar3 = ReadU32Leb128(this,&local_78,"info count");
              if (RVar3.enum_ == Error) goto LAB_00112f84;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd3])
                                (this->delegate_,(ulong)local_78);
              if (iVar2 != 0) {
                pcVar5 = "OnInitFunctionCount callback failed";
                goto LAB_00112f35;
              }
              while (bVar10 = local_78 != 0, local_78 = local_78 - 1, bVar10) {
                RVar3 = ReadU32Leb128(this,&value,"priority");
                if ((RVar3.enum_ == Error) ||
                   (RVar3 = ReadU32Leb128(this,&value_1,"symbol index"), RVar3.enum_ == Error))
                goto LAB_00112f84;
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd4])
                                  (this->delegate_,_value & 0xffffffff,(ulong)value_1);
                if (iVar2 != 0) {
                  pcVar5 = "OnInitFunction callback failed";
                  goto LAB_00112f35;
                }
              }
              break;
            case 7:
              RVar3 = ReadU32Leb128(this,&local_78,"count");
              if (RVar3.enum_ == Error) goto LAB_00112f84;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd5])
                                (this->delegate_,(ulong)local_78);
              if (iVar2 != 0) {
                pcVar5 = "OnComdatCount callback failed";
                goto LAB_00112f35;
              }
              while (bVar10 = local_78 != 0, local_78 = local_78 - 1, bVar10) {
                _value = 0;
                pcStack_60 = (char *)0x0;
                RVar3 = ReadStr(this,(string_view *)&value,"comdat name");
                if (((RVar3.enum_ == Error) ||
                    (RVar3 = ReadU32Leb128(this,&value_1,"flags"), RVar3.enum_ == Error)) ||
                   (RVar3 = ReadU32Leb128(this,&flags,"entry count"), RVar3.enum_ == Error))
                goto LAB_00112f84;
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd6])
                                  (this->delegate_,_value,pcStack_60,(ulong)value_1,(ulong)flags);
                if (iVar2 != 0) {
                  pcVar5 = "OnComdatBegin callback failed";
                  goto LAB_00112f35;
                }
                while (bVar10 = flags != 0, flags = flags - 1, bVar10) {
                  RVar3 = ReadU32Leb128(this,&kind,"kind");
                  if ((RVar3.enum_ == Error) ||
                     (RVar3 = ReadU32Leb128(this,&index,"index"), RVar3.enum_ == Error))
                  goto LAB_00112f84;
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd7])
                                    (this->delegate_,(ulong)kind,(ulong)index);
                  if (iVar2 != 0) {
                    pcVar5 = "OnComdatEntry callback failed";
                    goto LAB_00112f35;
                  }
                }
              }
              break;
            case 8:
              RVar3 = ReadU32Leb128(this,&local_78,"sym count");
              if (RVar3.enum_ == Error) goto LAB_00112f84;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xca])
                                (this->delegate_,(ulong)local_78);
              if (iVar2 != 0) {
                pcVar5 = "OnSymbolCount callback failed";
                goto LAB_00112f35;
              }
              if (local_78 != 0) {
                uVar8 = 0;
                local_38 = uVar6;
                do {
                  _value = 0;
                  pcStack_60 = (char *)0x0;
                  value_1 = 0;
                  flags = 0;
                  RVar3 = ReadU32Leb128(this,&flags,"sym type");
                  uVar6 = local_38;
                  if ((RVar3.enum_ == Error) ||
                     (RVar3 = ReadU32Leb128(this,&value_1,"sym flags"), uVar1 = flags,
                     uVar6 = local_38, RVar3.enum_ == Error)) goto LAB_00112f84;
                  if (5 < flags) goto LAB_00112d91;
                  if ((0x35U >> (flags & 0x1f) & 1) == 0) {
                    if (flags == 1) {
                      kind = 0;
                      index = 0;
                      size = 0;
                      RVar3 = ReadStr(this,(string_view *)&value,"symbol name");
                      uVar6 = local_38;
                      if ((RVar3.enum_ == Error) ||
                         (((value_1 & 0x10) == 0 &&
                          (((RVar3 = ReadU32Leb128(this,&kind,"segment"), uVar6 = local_38,
                            RVar3.enum_ == Error ||
                            (RVar3 = ReadU32Leb128(this,&index,"offset"), uVar6 = local_38,
                            RVar3.enum_ == Error)) ||
                           (RVar3 = ReadU32Leb128(this,&size,"size"), uVar6 = local_38,
                           RVar3.enum_ == Error)))))) goto LAB_00112f84;
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcb])
                                        (this->delegate_,uVar8,(ulong)value_1,_value,pcStack_60,
                                         (ulong)kind,(ulong)index,(ulong)size);
                      if (iVar2 != 0) {
                        pcVar5 = "OnDataSymbol callback failed";
                        goto LAB_00112f75;
                      }
                    }
                    else {
                      kind = 0;
                      RVar3 = ReadU32Leb128(this,&kind,"index");
                      uVar6 = local_38;
                      if (RVar3.enum_ == Error) goto LAB_00112f84;
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xce])
                                        (this->delegate_,uVar8,(ulong)value_1,(ulong)kind);
                      if (iVar2 != 0) {
                        pcVar5 = "OnSectionSymbol callback failed";
                        goto LAB_00112f75;
                      }
                    }
                  }
                  else {
                    kind = 0;
                    RVar3 = ReadU32Leb128(this,&kind,"index");
                    uVar6 = local_38;
                    if ((RVar3.enum_ == Error) ||
                       (((value_1 & 0x50) != 0x10 &&
                        (RVar3 = ReadStr(this,(string_view *)&value,"symbol name"), uVar6 = local_38
                        , RVar3.enum_ == Error)))) goto LAB_00112f84;
                    switch(uVar1) {
                    case 0:
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcc])
                                        (this->delegate_,uVar8,(ulong)value_1,_value,pcStack_60,
                                         (ulong)kind);
                      if (iVar2 != 0) {
                        pcVar5 = "OnFunctionSymbol callback failed";
LAB_00112f75:
                        PrintError(this,pcVar5);
                        uVar6 = local_38;
                        goto LAB_00112f84;
                      }
                      break;
                    default:
                      abort();
                    case 2:
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcd])
                                        (this->delegate_,uVar8,(ulong)value_1,_value,pcStack_60,
                                         (ulong)kind);
                      if (iVar2 != 0) {
                        pcVar5 = "OnGlobalSymbol callback failed";
                        goto LAB_00112f75;
                      }
                      break;
                    case 4:
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcf])
                                        (this->delegate_,uVar8,(ulong)value_1,_value,pcStack_60,
                                         (ulong)kind);
                      if (iVar2 != 0) {
                        pcVar5 = "OnTagSymbol callback failed";
                        goto LAB_00112f75;
                      }
                      break;
                    case 5:
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd0])
                                        (this->delegate_,uVar8,(ulong)value_1,_value,pcStack_60,
                                         (ulong)kind);
                      if (iVar2 != 0) {
                        pcVar5 = "OnTableSymbol callback failed";
                        goto LAB_00112f75;
                      }
                    }
                  }
LAB_00112d91:
                  uVar7 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar7;
                  uVar6 = local_38;
                } while (uVar7 < local_78);
              }
              break;
            default:
              (this->state_).offset = uVar9;
            }
            if ((this->state_).offset != uVar9) {
              PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar9);
LAB_00112f84:
              this->read_end_ = uVar6;
              return (Result)Error;
            }
            this->read_end_ = uVar6;
          } while ((this->state_).offset < uVar6);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd8])();
        if (iVar2 == 0) {
          EVar4 = Ok;
        }
        else {
          pcVar5 = "EndLinkingSection callback failed";
LAB_00112e82:
          PrintError(this,pcVar5);
        }
      }
      else {
        PrintError(this,"invalid linking metadata version: %u");
      }
    }
  }
  else {
    PrintError(this,"BeginLinkingSection callback failed");
    EVar4 = Error;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReader::ReadLinkingSection(Offset section_size) {
  CALLBACK(BeginLinkingSection, section_size);
  uint32_t version;
  CHECK_RESULT(ReadU32Leb128(&version, "version"));
  ERROR_UNLESS(version == 2, "invalid linking metadata version: %u", version);
  while (state_.offset < read_end_) {
    uint32_t linking_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&linking_type, "type"));
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    uint32_t count;
    switch (static_cast<LinkingEntryType>(linking_type)) {
      case LinkingEntryType::SymbolTable:
        CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
        CALLBACK(OnSymbolCount, count);
        for (Index i = 0; i < count; ++i) {
          std::string_view name;
          uint32_t flags = 0;
          uint32_t kind = 0;
          CHECK_RESULT(ReadU32Leb128(&kind, "sym type"));
          CHECK_RESULT(ReadU32Leb128(&flags, "sym flags"));
          SymbolType sym_type = static_cast<SymbolType>(kind);
          switch (sym_type) {
            case SymbolType::Function:
            case SymbolType::Global:
            case SymbolType::Tag:
            case SymbolType::Table: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0 ||
                  (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) != 0)
                CHECK_RESULT(ReadStr(&name, "symbol name"));
              switch (sym_type) {
                case SymbolType::Function:
                  CALLBACK(OnFunctionSymbol, i, flags, name, index);
                  break;
                case SymbolType::Global:
                  CALLBACK(OnGlobalSymbol, i, flags, name, index);
                  break;
                case SymbolType::Tag:
                  CALLBACK(OnTagSymbol, i, flags, name, index);
                  break;
                case SymbolType::Table:
                  CALLBACK(OnTableSymbol, i, flags, name, index);
                  break;
                default:
                  WABT_UNREACHABLE;
              }
              break;
            }
            case SymbolType::Data: {
              uint32_t segment = 0;
              uint32_t offset = 0;
              uint32_t size = 0;
              CHECK_RESULT(ReadStr(&name, "symbol name"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0) {
                CHECK_RESULT(ReadU32Leb128(&segment, "segment"));
                CHECK_RESULT(ReadU32Leb128(&offset, "offset"));
                CHECK_RESULT(ReadU32Leb128(&size, "size"));
              }
              CALLBACK(OnDataSymbol, i, flags, name, segment, offset, size);
              break;
            }
            case SymbolType::Section: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              CALLBACK(OnSectionSymbol, i, flags, index);
              break;
            }
          }
        }
        break;
      case LinkingEntryType::SegmentInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnSegmentInfoCount, count);
        for (Index i = 0; i < count; i++) {
          std::string_view name;
          Address alignment_log2;
          uint32_t flags;
          CHECK_RESULT(ReadStr(&name, "segment name"));
          CHECK_RESULT(ReadAlignment(&alignment_log2, "segment alignment"));
          CHECK_RESULT(CheckAlignment(&alignment_log2, "segment alignment"));
          CHECK_RESULT(ReadU32Leb128(&flags, "segment flags"));
          CALLBACK(OnSegmentInfo, i, name, alignment_log2, flags);
        }
        break;
      case LinkingEntryType::InitFunctions:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnInitFunctionCount, count);
        while (count--) {
          uint32_t priority;
          uint32_t symbol;
          CHECK_RESULT(ReadU32Leb128(&priority, "priority"));
          CHECK_RESULT(ReadU32Leb128(&symbol, "symbol index"));
          CALLBACK(OnInitFunction, priority, symbol);
        }
        break;
      case LinkingEntryType::ComdatInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnComdatCount, count);
        while (count--) {
          uint32_t flags;
          uint32_t entry_count;
          std::string_view name;
          CHECK_RESULT(ReadStr(&name, "comdat name"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CHECK_RESULT(ReadU32Leb128(&entry_count, "entry count"));
          CALLBACK(OnComdatBegin, name, flags, entry_count);
          while (entry_count--) {
            uint32_t kind;
            uint32_t index;
            CHECK_RESULT(ReadU32Leb128(&kind, "kind"));
            CHECK_RESULT(ReadU32Leb128(&index, "index"));
            ComdatType comdat_type = static_cast<ComdatType>(kind);
            CALLBACK(OnComdatEntry, comdat_type, index);
          }
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndLinkingSection);
  return Result::Ok;
}